

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
AbstractModuleClient::getAvailableTrodesData
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,AbstractModuleClient *this,string *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pNVar2;
  bool bVar3;
  int iVar4;
  pointer pNVar5;
  long lVar6;
  NDevice *pNVar7;
  string *psVar8;
  unsigned_long local_110;
  TrodesConfig local_108;
  undefined1 local_d0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  NDevice *local_98;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> local_90;
  string local_78;
  NDevice *local_58;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = std::operator==(data,"neurostream");
  if (bVar3) {
    std::__cxx11::string::string
              ((string *)&local_108,"Format: \'ntrode_id, nth channel\'",
               (allocator *)(local_d0 + 0x18));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    MlmWrap::getTrodesConfig(&local_108,&this->super_MlmWrap);
    TrodesConfig::getNTrodes((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)local_d0,&local_108);
    TrodesConfig::~TrodesConfig(&local_108);
    local_58 = (NDevice *)local_d0._8_8_;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d0 + 0x18);
    for (pNVar7 = (NDevice *)local_d0._0_8_; pNVar7 != local_58; pNVar7 = pNVar7 + 1) {
      local_110 = 1;
      while( true ) {
        NTrodeObj::getHw_chans((vector<int,_std::allocator<int>_> *)&local_108,(NTrodeObj *)pNVar7);
        local_98 = (NDevice *)(local_110 - 1);
        lVar6 = (long)local_108.devices.super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                      _M_impl.super__Vector_impl_data._M_start -
                (long)local_108.super_NetworkDataType._vptr_NetworkDataType;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
        if ((NDevice *)(lVar6 >> 2) <= local_98) break;
        NTrodeObj::getId_abi_cxx11_(&local_78,(NTrodeObj *)pNVar7);
        std::operator+(pbVar1,&local_78,",");
        std::__cxx11::to_string(&local_50,local_110);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_108,pbVar1,&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)pbVar1);
        std::__cxx11::string::~string((string *)&local_78);
        local_110 = local_110 + 1;
      }
    }
    psVar8 = (string *)local_d0;
  }
  else {
    bVar3 = std::operator==(data,"lfpstream");
    if (!bVar3) {
      bVar3 = std::operator==(data,"analogstream");
      if (bVar3) {
        std::__cxx11::string::string
                  ((string *)&local_108,"Format: \'Device_name, channel_id\'",
                   (allocator *)(local_d0 + 0x18));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        MlmWrap::getTrodesConfig(&local_108,&this->super_MlmWrap);
        TrodesConfig::getDevices((vector<NDevice,_std::allocator<NDevice>_> *)local_d0,&local_108);
        TrodesConfig::~TrodesConfig(&local_108);
        local_98 = (NDevice *)local_d0._8_8_;
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d0 + 0x18);
        for (pNVar7 = (NDevice *)local_d0._0_8_; pNVar7 != local_98; pNVar7 = pNVar7 + 1) {
          NDevice::getChannels(&local_90,pNVar7);
          pNVar2 = local_90.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pNVar5 = local_90.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                        ._M_impl.super__Vector_impl_data._M_start; pNVar5 != pNVar2;
              pNVar5 = pNVar5 + 1) {
            iVar4 = NDeviceChannel::getType(pNVar5);
            if (iVar4 == 1) {
              NDevice::getName_abi_cxx11_(&local_78,pNVar7);
              std::operator+(pbVar1,&local_78,",");
              NDeviceChannel::getId_abi_cxx11_(&local_50,pNVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_108,pbVar1,&local_50);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)pbVar1);
              std::__cxx11::string::~string((string *)&local_78);
            }
          }
          std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_90);
        }
      }
      else {
        bVar3 = std::operator==(data,"digitalstream");
        if (!bVar3) {
          bVar3 = std::operator==(data,"spikestream");
          if (!bVar3) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::string
                    ((string *)&local_108,"Format: \'ntrode_id, cluster\'",
                     (allocator *)(local_d0 + 0x18));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108
                    );
          std::__cxx11::string::~string((string *)&local_108);
          MlmWrap::getTrodesConfig(&local_108,&this->super_MlmWrap);
          TrodesConfig::getNTrodes
                    ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_78,&local_108);
          TrodesConfig::~TrodesConfig(&local_108);
          psVar8 = (string *)(local_d0 + 0x18);
          for (; local_78._M_dataplus._M_p != (pointer)local_78._M_string_length;
              local_78._M_dataplus._M_p = local_78._M_dataplus._M_p + 0x48) {
            NTrodeObj::getId_abi_cxx11_(psVar8,(NTrodeObj *)local_78._M_dataplus._M_p);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108,psVar8,", [0-8]");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)psVar8);
          }
          psVar8 = &local_78;
          goto LAB_002469e2;
        }
        std::__cxx11::string::string
                  ((string *)&local_108,"Format: \'Device_name, channel_id\'",
                   (allocator *)(local_d0 + 0x18));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        MlmWrap::getTrodesConfig(&local_108,&this->super_MlmWrap);
        TrodesConfig::getDevices((vector<NDevice,_std::allocator<NDevice>_> *)local_d0,&local_108);
        TrodesConfig::~TrodesConfig(&local_108);
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d0 + 0x18);
        for (pNVar7 = (NDevice *)local_d0._0_8_; pNVar7 != (NDevice *)local_d0._8_8_;
            pNVar7 = pNVar7 + 1) {
          NDevice::getChannels(&local_90,pNVar7);
          pNVar2 = local_90.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pNVar5 = local_90.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                        ._M_impl.super__Vector_impl_data._M_start; pNVar5 != pNVar2;
              pNVar5 = pNVar5 + 1) {
            iVar4 = NDeviceChannel::getType(pNVar5);
            if (iVar4 == 0) {
              NDevice::getName_abi_cxx11_(&local_78,pNVar7);
              std::operator+(pbVar1,&local_78,",");
              NDeviceChannel::getId_abi_cxx11_(&local_50,pNVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_108,pbVar1,&local_50);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)pbVar1);
              std::__cxx11::string::~string((string *)&local_78);
            }
          }
          std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_90);
        }
      }
      std::vector<NDevice,_std::allocator<NDevice>_>::~vector
                ((vector<NDevice,_std::allocator<NDevice>_> *)local_d0);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              ((string *)&local_108,"Format: \'ntrode_id\'",(allocator *)(local_d0 + 0x18));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    MlmWrap::getTrodesConfig(&local_108,&this->super_MlmWrap);
    TrodesConfig::getNTrodes
              ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(local_d0 + 0x18),&local_108);
    TrodesConfig::~TrodesConfig(&local_108);
    for (; local_b8._M_dataplus._M_p != (pointer)local_b8._M_string_length;
        local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p + 0x48) {
      NTrodeObj::getId_abi_cxx11_((string *)&local_108,(NTrodeObj *)local_b8._M_dataplus._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    psVar8 = (string *)(local_d0 + 0x18);
  }
LAB_002469e2:
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)psVar8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> AbstractModuleClient::getAvailableTrodesData(std::string data){
    std::vector<std::string> list;
    if(data == hfType_NEURO){
        list.push_back("Format: 'ntrode_id, nth channel'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            for(size_t ch = 0; ch < nt.getHw_chans().size(); ch++){
                list.push_back(nt.getId() + "," + std::to_string(ch+1));
            }
        }
    }
    else if(data == hfType_LFP){
        list.push_back("Format: 'ntrode_id'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            list.push_back(nt.getId());
        }
    }
    else if(data == hfType_ANALOG){
        list.push_back("Format: 'Device_name, channel_id'");
        for(auto &dv : getTrodesConfig().getDevices()){
            for(auto &ch : dv.getChannels()){
                if(ch.getType() == 1)
                    list.push_back(dv.getName() + "," + ch.getId());
            }
        }
    }
    else if(data == hfType_DIGITAL){
        list.push_back("Format: 'Device_name, channel_id'");
        for(auto &dv : getTrodesConfig().getDevices()){
            for(auto &ch : dv.getChannels()){
                if(ch.getType() == 0)
                    list.push_back(dv.getName() + "," + ch.getId());
            }
        }
    }
    else if(data == hfType_SPIKE){
        list.push_back("Format: 'ntrode_id, cluster'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            list.push_back(nt.getId() + ", [0-8]");
        }
    }
    return list;
}